

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O2

void __thiscall
filtered_union_find::filtered_union_find
          (filtered_union_find *this,vector<float,_std::allocator<float>_> *_filtration)

{
  pointer pfVar1;
  pointer pfVar2;
  pointer piVar3;
  size_t i;
  long lVar4;
  allocator_type local_1b;
  value_type_conflict6 local_1a;
  allocator_type local_19;
  
  std::vector<int,_std::allocator<int>_>::vector
            (&this->parent,
             (long)(_filtration->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(_filtration->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2,&local_19);
  local_1a = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->rank,
             (long)(_filtration->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(_filtration->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2,&local_1a,&local_1b);
  std::vector<float,_std::allocator<float>_>::vector(&this->filtration,_filtration);
  pfVar1 = (_filtration->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pfVar2 = (_filtration->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  piVar3 = (this->parent).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar4 = 0; (long)pfVar1 - (long)pfVar2 >> 2 != lVar4; lVar4 = lVar4 + 1) {
    piVar3[lVar4] = (int)lVar4;
  }
  return;
}

Assistant:

filtered_union_find(const std::vector<value_t>& _filtration)
	    : parent(_filtration.size()), rank(_filtration.size(), 0), filtration(_filtration) {
		for (size_t i = 0ul; i < _filtration.size(); ++i) parent[i] = index_t(i);
	}